

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O0

void set_scheme_id_uri(vector<unsigned_char,_std::allocator<unsigned_char>_> *moov_in,string *urn)

{
  value_type vVar1;
  ulong uVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint32_t uVar7;
  size_type sVar8;
  reference pvVar9;
  ulong uVar10;
  value_type *pvVar11;
  difference_type __n;
  long lVar12;
  size_type sVar13;
  undefined1 *puVar14;
  allocator local_2a9;
  uint32_t or_size_7;
  uint32_t local_288;
  allocator local_281;
  uint32_t or_size_6;
  uint32_t local_260;
  allocator local_259;
  uint32_t or_size_5;
  uint32_t local_238;
  allocator local_231;
  uint32_t or_size_4;
  uint32_t local_210;
  allocator local_209;
  uint32_t or_size_3;
  uint32_t local_1e8;
  allocator local_1e1;
  uint32_t or_size_2;
  uint32_t local_1c0;
  allocator local_1b9;
  uint32_t or_size_1;
  uint32_t local_198;
  allocator local_191;
  uint32_t or_size;
  ulong local_170;
  size_t i_2;
  size_t i_1;
  ulong local_158;
  size_t i;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_148;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_140;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_138;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_130;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_128;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_120;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_118;
  allocator<unsigned_char> local_f9;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_f8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_f0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_e8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  ulong local_c0;
  size_t l;
  string local_b0 [8];
  string or_urn;
  allocator local_79;
  string local_78 [32];
  ulong local_58;
  size_t k;
  vector<unsigned_char,_std::allocator<unsigned_char>_> l_last;
  vector<unsigned_char,_std::allocator<unsigned_char>_> l_first;
  int32_t size_diff;
  string *urn_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *moov_in_local;
  
  l_first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &l_last.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&k);
  local_58 = 0;
  while( true ) {
    uVar2 = local_58;
    sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(moov_in);
    if (sVar8 - 0x10 <= uVar2) goto LAB_0010b9e8;
    pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (moov_in,local_58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,(char *)pvVar9,&local_79);
    iVar5 = std::__cxx11::string::compare((char *)local_78);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    if (iVar5 == 0) break;
    local_58 = local_58 + 1;
  }
  pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (moov_in,local_58 + 0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,(char *)pvVar9,(allocator *)((long)&l + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&l + 7));
  iVar5 = std::__cxx11::string::size();
  iVar6 = std::__cxx11::string::size();
  l_first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = iVar5 - iVar6;
  if (l_first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
    for (local_c0 = 0; uVar2 = local_c0, uVar10 = std::__cxx11::string::size(), uVar2 < uVar10;
        local_c0 = local_c0 + 1) {
      pvVar11 = (value_type *)std::__cxx11::string::operator[]((ulong)urn);
      vVar1 = *pvVar11;
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (moov_in,local_58 + 0x18 + local_c0);
      *pvVar9 = vVar1;
    }
  }
  else {
    local_e0._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(moov_in);
    local_f8._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(moov_in);
    local_f0 = __gnu_cxx::
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator+(&local_f8,local_58);
    local_e8 = __gnu_cxx::
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator+(&local_f0,0x18);
    std::allocator<unsigned_char>::allocator(&local_f9);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_d8,local_e0,local_e8,
               &local_f9);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &l_last.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_d8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_d8);
    std::allocator<unsigned_char>::~allocator(&local_f9);
    local_140._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(moov_in);
    local_138 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_140,local_58);
    local_130 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_138,0x18);
    __n = std::__cxx11::string::size();
    local_128 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_130,__n);
    local_120 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_128,1);
    local_148._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(moov_in);
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&i + 7));
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_118,local_120,local_148
               ,(allocator<unsigned_char> *)((long)&i + 7));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&k,&local_118);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_118);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&i + 7));
  }
  std::__cxx11::string::~string(local_b0);
LAB_0010b9e8:
  if (l_first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ != 0) {
    sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &l_last.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(moov_in,sVar8);
    sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(moov_in);
    lVar12 = std::__cxx11::string::size();
    sVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&k);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              (moov_in,sVar13 + 1 + sVar8 + lVar12);
    for (local_158 = 0; uVar2 = local_158, uVar10 = std::__cxx11::string::size(), uVar2 < uVar10;
        local_158 = local_158 + 1) {
      puVar14 = (undefined1 *)std::__cxx11::string::operator[]((ulong)urn);
      i_1._7_1_ = *puVar14;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (moov_in,(value_type *)((long)&i_1 + 7));
    }
    i_1._6_1_ = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (moov_in,(value_type *)((long)&i_1 + 6));
    for (i_2 = 0; sVar3 = i_2,
        sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&k),
        sVar3 < sVar8; i_2 = i_2 + 1) {
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&k,i_2);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(moov_in,pvVar9);
    }
    for (local_170 = 0; uVar2 = local_170,
        sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(moov_in),
        uVar2 < sVar8; local_170 = local_170 + 1) {
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (moov_in,local_170);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&or_size,"stsd",&local_191);
      bVar4 = compare_4cc((char *)pvVar9,(string *)&or_size);
      std::__cxx11::string::~string((string *)&or_size);
      std::allocator<char>::~allocator((allocator<char> *)&local_191);
      if (bVar4) {
        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (moov_in,local_170 - 4);
        uVar7 = anon_unknown.dwarf_19df6::fmp4_read_uint32((char *)pvVar9);
        local_198 = uVar7 - l_first.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (moov_in,local_170 - 4);
        anon_unknown.dwarf_19df6::fmp4_write_uint32
                  (uVar7 - l_first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,(char *)pvVar9);
      }
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (moov_in,local_170);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&or_size_1,"stbl",&local_1b9);
      bVar4 = compare_4cc((char *)pvVar9,(string *)&or_size_1);
      std::__cxx11::string::~string((string *)&or_size_1);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
      if (bVar4) {
        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (moov_in,local_170 - 4);
        uVar7 = anon_unknown.dwarf_19df6::fmp4_read_uint32((char *)pvVar9);
        local_1c0 = uVar7 - l_first.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (moov_in,local_170 - 4);
        anon_unknown.dwarf_19df6::fmp4_write_uint32
                  (uVar7 - l_first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,(char *)pvVar9);
      }
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (moov_in,local_170);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&or_size_2,"uri ",&local_1e1);
      bVar4 = compare_4cc((char *)pvVar9,(string *)&or_size_2);
      std::__cxx11::string::~string((string *)&or_size_2);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
      if (bVar4) {
        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (moov_in,local_170 - 4);
        uVar7 = anon_unknown.dwarf_19df6::fmp4_read_uint32((char *)pvVar9);
        local_1e8 = uVar7 - l_first.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (moov_in,local_170 - 4);
        anon_unknown.dwarf_19df6::fmp4_write_uint32
                  (uVar7 - l_first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,(char *)pvVar9);
      }
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (moov_in,local_170);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&or_size_3,"urim",&local_209);
      bVar4 = compare_4cc((char *)pvVar9,(string *)&or_size_3);
      std::__cxx11::string::~string((string *)&or_size_3);
      std::allocator<char>::~allocator((allocator<char> *)&local_209);
      if (bVar4) {
        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (moov_in,local_170 - 4);
        uVar7 = anon_unknown.dwarf_19df6::fmp4_read_uint32((char *)pvVar9);
        local_210 = uVar7 - l_first.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (moov_in,local_170 - 4);
        anon_unknown.dwarf_19df6::fmp4_write_uint32
                  (uVar7 - l_first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,(char *)pvVar9);
      }
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (moov_in,local_170);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&or_size_4,"minf",&local_231);
      bVar4 = compare_4cc((char *)pvVar9,(string *)&or_size_4);
      std::__cxx11::string::~string((string *)&or_size_4);
      std::allocator<char>::~allocator((allocator<char> *)&local_231);
      if (bVar4) {
        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (moov_in,local_170 - 4);
        uVar7 = anon_unknown.dwarf_19df6::fmp4_read_uint32((char *)pvVar9);
        local_238 = uVar7 - l_first.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (moov_in,local_170 - 4);
        anon_unknown.dwarf_19df6::fmp4_write_uint32
                  (uVar7 - l_first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,(char *)pvVar9);
      }
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (moov_in,local_170);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&or_size_5,"mdia",&local_259);
      bVar4 = compare_4cc((char *)pvVar9,(string *)&or_size_5);
      std::__cxx11::string::~string((string *)&or_size_5);
      std::allocator<char>::~allocator((allocator<char> *)&local_259);
      if (bVar4) {
        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (moov_in,local_170 - 4);
        uVar7 = anon_unknown.dwarf_19df6::fmp4_read_uint32((char *)pvVar9);
        local_260 = uVar7 - l_first.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (moov_in,local_170 - 4);
        anon_unknown.dwarf_19df6::fmp4_write_uint32
                  (uVar7 - l_first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,(char *)pvVar9);
      }
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (moov_in,local_170);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&or_size_6,"trak",&local_281);
      bVar4 = compare_4cc((char *)pvVar9,(string *)&or_size_6);
      std::__cxx11::string::~string((string *)&or_size_6);
      std::allocator<char>::~allocator((allocator<char> *)&local_281);
      if (bVar4) {
        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (moov_in,local_170 - 4);
        uVar7 = anon_unknown.dwarf_19df6::fmp4_read_uint32((char *)pvVar9);
        local_288 = uVar7 - l_first.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (moov_in,local_170 - 4);
        anon_unknown.dwarf_19df6::fmp4_write_uint32
                  (uVar7 - l_first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,(char *)pvVar9);
      }
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (moov_in,local_170);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&or_size_7,"moov",&local_2a9);
      bVar4 = compare_4cc((char *)pvVar9,(string *)&or_size_7);
      std::__cxx11::string::~string((string *)&or_size_7);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
      if (bVar4) {
        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (moov_in,local_170 - 4);
        uVar7 = anon_unknown.dwarf_19df6::fmp4_read_uint32((char *)pvVar9);
        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (moov_in,local_170 - 4);
        anon_unknown.dwarf_19df6::fmp4_write_uint32
                  (uVar7 - l_first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,(char *)pvVar9);
      }
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&k);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &l_last.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void set_scheme_id_uri(std::vector<uint8_t> &moov_in, 
	const std::string& urn)
{
	int32_t size_diff = 0;

	std::vector<uint8_t> l_first;
	std::vector<uint8_t> l_last;

	// find the uri box containing the description of the urn, caerfull only use for the enclosed mdat box in the source code
	for (std::size_t k = 0; k < moov_in.size() - 16; k++)
	{
		if (std::string((char *)&moov_in[k]).compare("urim") == 0)
		{
			//cout << "urim box found" << endl;
			std::string or_urn = std::string((char *)&moov_in[k + 24]);
			size_diff = (int32_t)(or_urn.size() - urn.size());

			if (size_diff == 0)
			{
				for (std::size_t l = 0; l < urn.size(); l++)
					moov_in[k + 24 + l] = urn[l];
			}
			else
			{
				// first part of the string
				l_first = std::vector<uint8_t>(moov_in.begin(), moov_in.begin() + k + 24);
				// last part of the string
				l_last = std::vector<uint8_t>(moov_in.begin() + k + 24 + or_urn.size() + 1, moov_in.end());
			}
			break;
		}
	}

	// new string representing the moov_box 
	if (size_diff != 0)
	{
		// cout << "scheme size difference is: " << size_diff << endl;

		moov_in.resize(l_first.size());
		moov_in.reserve(moov_in.size() + urn.size() + l_last.size() + 1);

		for (std::size_t i = 0; i < urn.size(); i++)
			moov_in.push_back(urn[i]);
		moov_in.push_back('\0');
		for (std::size_t i = 0; i < l_last.size(); i++)
			moov_in.push_back(l_last[i]);

		for (std::size_t i = 0; i < moov_in.size(); i++)
		{
			if (compare_4cc((char *)&moov_in[i], std::string("stsd")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
			if (compare_4cc((char *)&moov_in[i], std::string("stbl")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
			if (compare_4cc((char *)&moov_in[i], std::string("uri ")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
			if (compare_4cc((char *)&moov_in[i], std::string("urim")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
			if (compare_4cc((char *)&moov_in[i], std::string("minf")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
			if (compare_4cc((char *)&moov_in[i], std::string("mdia")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
			if (compare_4cc((char *)&moov_in[i], std::string("trak")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
			if (compare_4cc((char *)&moov_in[i], std::string("moov")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
		}
	}
}